

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

bool __thiscall
XipFile::extractfile(XipFile *this,string *romname,string *dstpath,filetypefilter_ptr *filter)

{
  long *plVar1;
  _Base_ptr this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  int iVar3;
  iterator iVar4;
  FileReader *pFVar5;
  bool bVar6;
  ReadWriter_ptr w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  FileReader *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
          ::find(&(this->_files)._M_t,romname);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
    printf("extract: %s not found\n",(romname->_M_dataplus)._M_p);
    return false;
  }
  if (g_verbose != 0) {
    XipEntry::listentry(*(XipEntry **)(iVar4._M_node + 2),this);
  }
  plVar1 = *(long **)(iVar4._M_node + 2);
  this_00 = iVar4._M_node[2]._M_parent;
  if (this_00 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
    }
  }
  peVar2 = (filter->super___shared_ptr<filetypefilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (**(code **)(*plVar1 + 0x30))(local_40,plVar1,this);
    iVar3 = (*peVar2->_vptr_filetypefilter[2])(peVar2,local_40);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((char)iVar3 == '\0') {
      if (g_verbose < 2) {
        bVar6 = false;
      }
      else {
        bVar6 = false;
        printf("filtered %s\n",(romname->_M_dataplus)._M_p);
      }
      goto LAB_0011d53a;
    }
  }
  pFVar5 = (FileReader *)operator_new(0x40);
  FileReader::FileReader(pFVar5,dstpath);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileReader*>(&local_58,pFVar5);
  local_48 = local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  local_50 = pFVar5;
  (**(code **)(*plVar1 + 0x20))(plVar1,this,&local_50);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if ((pFVar5 != (FileReader *)0x0) &&
     (pFVar5 = (FileReader *)__dynamic_cast(pFVar5,&ReadWriter::typeinfo,&FileReader::typeinfo,0),
     this_01._M_pi = local_58._M_pi, pFVar5 != (FileReader *)0x0)) {
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      }
    }
    FileReader::setunixtime(pFVar5,(ulong)plVar1[3] / 10000000 - 0x2b6109100);
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  bVar6 = true;
LAB_0011d53a:
  if (this_00 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  return bVar6;
}

Assistant:

virtual bool extractfile(const std::string&romname, const std::string& dstpath, filetypefilter_ptr filter)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("extract: %s not found\n", romname.c_str());
            return false;
        }

        if (g_verbose)
            (*fi).second->listentry(*this);

        XipEntry_ptr srcfile= (*fi).second;
        if (filter && !filter->match(srcfile->getdatareader(*this))) {
            if (g_verbose > 1)
                printf("filtered %s\n", romname.c_str());
            return false;
        }

        ReadWriter_ptr w(new FileReader(dstpath, FileReader::createnew));

        srcfile->tostream(*this, w);

        std::shared_ptr<FileReader> dstfile= std::dynamic_pointer_cast<FileReader>(w);
        if (dstfile) {
            try {
            dstfile->setunixtime(srcfile->getunixtime());
            }
            catch(...)
            {
                printf("xip.get: error setting filetime\n");
            }
        }
        return true;
    }